

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O1

void __thiscall glslang::TPoolAllocator::~TPoolAllocator(TPoolAllocator *this)

{
  tHeader *ptVar1;
  pointer ptVar2;
  TAllocation **ppTVar3;
  TAllocation *alloc;
  TAllocation *this_00;
  tHeader *ptVar4;
  
  ptVar4 = this->inUseList;
  while (ptVar4 != (tHeader *)0x0) {
    ppTVar3 = &ptVar4->lastAllocation;
    ptVar4 = ptVar4->nextPage;
    for (this_00 = *ppTVar3; this_00 != (TAllocation *)0x0; this_00 = this_00->prevAlloc) {
      TAllocation::check(this_00);
    }
    if (this->inUseList != (tHeader *)0x0) {
      operator_delete__(this->inUseList);
    }
    this->inUseList = ptVar4;
  }
  ptVar4 = this->freeList;
  while (ptVar4 != (tHeader *)0x0) {
    ptVar1 = ptVar4->nextPage;
    operator_delete__(ptVar4);
    this->freeList = ptVar1;
    ptVar4 = ptVar1;
  }
  ptVar2 = (this->stack).
           super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ptVar2,(long)(this->stack).
                               super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar2);
  return;
}

Assistant:

TPoolAllocator::~TPoolAllocator()
{
    while (inUseList) {
        tHeader* next = inUseList->nextPage;
        inUseList->~tHeader();
        delete [] reinterpret_cast<char*>(inUseList);
        inUseList = next;
    }

    //
    // Always delete the free list memory - it can't be being
    // (correctly) referenced, whether the pool allocator was
    // global or not.  We should not check the guard blocks
    // here, because we did it already when the block was
    // placed into the free list.
    //
    while (freeList) {
        tHeader* next = freeList->nextPage;
        delete [] reinterpret_cast<char*>(freeList);
        freeList = next;
    }
}